

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day09.cpp
# Opt level: O1

void day09(input_t input)

{
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ulong uVar8;
  long lVar9;
  uint uVar10;
  iterator __begin1;
  long lVar11;
  undefined1 (*__ptr) [32];
  byte bVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 uVar17;
  ulong uVar18;
  undefined8 uVar19;
  long lVar20;
  undefined1 (*pauVar21) [32];
  long lVar22;
  undefined1 (*pauVar23) [32];
  int *piVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> score;
  allocator_type local_49;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  if (input.len == 0) {
    uVar13 = 0;
    uVar15 = 0;
  }
  else {
    lVar11 = 0;
    uVar15 = 0;
    uVar25 = 0;
    uVar13 = 0;
    do {
      bVar12 = input.s[lVar11] - 0x30;
      uVar26 = uVar13;
      if (bVar12 < 10) {
        uVar10 = (uint)bVar12 + uVar25 * 10;
      }
      else {
        uVar10 = 0;
        if (((uVar25 != 0) && (uVar10 = uVar25, input.s[lVar11] == ' ')) &&
           (uVar26 = uVar25, uVar10 = 0, uVar13 != 0)) {
          uVar15 = (ulong)uVar25;
          uVar26 = uVar13;
        }
      }
      uVar25 = uVar10;
      uVar13 = uVar26;
      lVar11 = lVar11 + 1;
    } while (input.len != lVar11);
  }
  lVar11 = 0x20;
  __ptr = (undefined1 (*) [32])aligned_alloc(0x20,(int)uVar15 * 0x180);
  *(undefined8 *)*__ptr = 0x1400000002;
  *(undefined8 *)(*__ptr + 8) = 0x150000000a;
  *(undefined8 *)(*__ptr + 0x10) = 0x1600000005;
  *(undefined8 *)(*__ptr + 0x18) = 0x10000000b;
  *(undefined8 *)__ptr[1] = 0x60000000c;
  *(undefined8 *)(__ptr[1] + 8) = 0x30000000d;
  *(undefined8 *)(__ptr[1] + 0x10) = 0x70000000e;
  *(undefined8 *)(__ptr[1] + 0x18) = 0xf;
  *(undefined1 (*) [64])(*__ptr + 0x18) = _DAT_00115a58;
  if (uVar13 / 0x17 + (uVar13 / 0x17) * -0x18 + uVar13 == 0) {
    uVar13 = uVar13 / 0x17;
  }
  uVar18 = (ulong)uVar13;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48,uVar18,&local_49);
  *local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x20;
  auVar34 = vpmovsxbd_avx2(ZEXT816(0x703060205010400));
  auVar32 = vpermd_avx2(auVar34,*__ptr);
  auVar41 = ZEXT3264(auVar32);
  uVar13 = (int)(uVar15 / 0x17) - 1;
  if (uVar13 == 0) {
    pauVar21 = (undefined1 (*) [32])(__ptr[2] + 0x18);
    pauVar23 = __ptr + 1;
    uVar16 = 0;
    iVar14 = 0x2e;
    auVar32 = vpmovsxbd_avx2(ZEXT816(0x1b1f1a1e191d181c));
    auVar40 = ZEXT3264(auVar32);
  }
  else {
    iVar14 = 0x2e;
    auVar32 = vpmovsxbd_avx2(ZEXT816(0x1b1f1a1e191d181c));
    auVar40 = ZEXT3264(auVar32);
    lVar22 = -0x20;
    auVar32 = vpmovsxbd_avx2(ZEXT816(0xe070c050a030801));
    auVar33._8_4_ = 8;
    auVar33._0_8_ = 0x800000008;
    auVar33._12_4_ = 8;
    auVar33._16_4_ = 8;
    auVar33._20_4_ = 8;
    auVar33._24_4_ = 8;
    auVar33._28_4_ = 8;
    auVar3 = vpmovsxbd_avx2(ZEXT816(0x80d080c100e1008));
    auVar4 = vpmovsxbd_avx2(ZEXT816(0x607040205010300));
    auVar5 = vpmovsxbd_avx2(ZEXT816(0x60e07050b0a0301));
    auVar6 = vpmovsxbd_avx2(ZEXT816(0x4000000));
    auVar43._8_4_ = 0x17;
    auVar43._0_8_ = 0x1700000017;
    auVar43._12_4_ = 0x17;
    auVar43._16_4_ = 0x17;
    auVar43._20_4_ = 0x17;
    auVar43._24_4_ = 0x17;
    auVar43._28_4_ = 0x17;
    uVar16 = 0;
    lVar9 = 0x58;
    do {
      lVar20 = lVar9;
      auVar39 = auVar40._0_32_;
      auVar31 = vpblendd_avx2(auVar41._0_32_,auVar39,0xaa);
      *(undefined1 (*) [32])(*__ptr + lVar20) = auVar31;
      auVar31 = vpermt2d_avx512vl(auVar41._0_32_,auVar32,auVar39);
      *(undefined1 (*) [32])(__ptr[1] + lVar20) = auVar31;
      auVar31 = vpaddd_avx2(auVar39,auVar33);
      auVar7 = vpermd_avx2(auVar34,*(undefined1 (*) [32])(*__ptr + lVar11));
      auVar44 = vpblendd_avx2(auVar7,auVar31,0xaa);
      *(undefined1 (*) [32])(__ptr[2] + lVar20) = auVar44;
      auVar31 = vpermt2d_avx512vl(auVar7,auVar32,auVar31);
      *(undefined1 (*) [32])(__ptr[3] + lVar20) = auVar31;
      auVar31 = vpaddd_avx2(auVar39,auVar3);
      auVar7 = vpermd_avx2(auVar4,*(undefined1 (*) [32])(__ptr[1] + lVar11));
      auVar44 = vpblendd_avx2(auVar31,auVar7,5);
      iVar27 = *(int *)(__ptr[1] + lVar11 + 8);
      *(undefined1 (*) [32])(__ptr[4] + lVar20) = auVar44;
      uVar16 = uVar16 + 1;
      if (uVar18 <= uVar16) {
        uVar16 = 0;
      }
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16] =
           local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar16] + (ulong)(uint)(iVar27 + iVar14);
      auVar31 = vpermt2d_avx512vl(auVar7,auVar5,auVar31);
      auVar31 = vpaddd_avx2(auVar31,auVar6);
      auVar41 = ZEXT3264(auVar31);
      auVar31 = vpaddd_avx2(auVar43,auVar39);
      auVar40 = ZEXT3264(auVar31);
      iVar14 = iVar14 + 0x17;
      lVar11 = lVar11 + 0x40;
      lVar1 = (ulong)uVar13 * 0x40 + -0x40 + lVar22;
      lVar22 = lVar22 + -0x40;
      lVar9 = lVar20 + 0x94;
    } while (lVar1 != -0x20);
    pauVar23 = (undefined1 (*) [32])((long)__ptr - lVar22);
    pauVar21 = (undefined1 (*) [32])(__ptr[4] + lVar20 + 0x14);
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar19 = 0;
  }
  else {
    auVar35 = vpbroadcastq_avx512f();
    auVar35 = vpsrlq_avx512f(auVar35,3);
    auVar42 = ZEXT1664((undefined1  [16])0x0);
    uVar28 = 0;
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar37 = vmovdqa64_avx512f(auVar42);
      auVar42 = vpbroadcastq_avx512f();
      auVar42 = vporq_avx512f(auVar42,auVar36);
      uVar8 = vpcmpuq_avx512f(auVar42,auVar35,2);
      auVar38 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (local_48.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar28));
      auVar42._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * auVar38._8_8_;
      auVar42._0_8_ = (ulong)((byte)uVar8 & 1) * auVar38._0_8_;
      auVar42._16_8_ = (ulong)((byte)(uVar8 >> 2) & 1) * auVar38._16_8_;
      auVar42._24_8_ = (ulong)((byte)(uVar8 >> 3) & 1) * auVar38._24_8_;
      auVar42._32_8_ = (ulong)((byte)(uVar8 >> 4) & 1) * auVar38._32_8_;
      auVar42._40_8_ = (ulong)((byte)(uVar8 >> 5) & 1) * auVar38._40_8_;
      auVar42._48_8_ = (ulong)((byte)(uVar8 >> 6) & 1) * auVar38._48_8_;
      auVar42._56_8_ = (uVar8 >> 7) * auVar38._56_8_;
      auVar42 = vpmaxuq_avx512f(auVar37,auVar42);
      uVar28 = uVar28 + 8;
    } while ((((ulong)((long)local_48.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish +
                      (-8 - (long)local_48.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) >> 3) + 8 &
             0x3ffffffffffffff8) != uVar28);
    auVar35 = vmovdqa64_avx512f(auVar42);
    bVar2 = (bool)((byte)uVar8 & 1);
    auVar36._0_8_ = (ulong)bVar2 * auVar35._0_8_ | (ulong)!bVar2 * auVar37._0_8_;
    bVar2 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar36._8_8_ = (ulong)bVar2 * auVar35._8_8_ | (ulong)!bVar2 * auVar37._8_8_;
    bVar2 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar36._16_8_ = (ulong)bVar2 * auVar35._16_8_ | (ulong)!bVar2 * auVar37._16_8_;
    bVar2 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar36._24_8_ = (ulong)bVar2 * auVar35._24_8_ | (ulong)!bVar2 * auVar37._24_8_;
    bVar2 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar36._32_8_ = (ulong)bVar2 * auVar35._32_8_ | (ulong)!bVar2 * auVar37._32_8_;
    bVar2 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar36._40_8_ = (ulong)bVar2 * auVar35._40_8_ | (ulong)!bVar2 * auVar37._40_8_;
    bVar2 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar36._48_8_ = (ulong)bVar2 * auVar35._48_8_ | (ulong)!bVar2 * auVar37._48_8_;
    auVar36._56_8_ = (uVar8 >> 7) * auVar35._56_8_ | (ulong)!SUB81(uVar8 >> 7,0) * auVar37._56_8_;
    auVar32 = vextracti64x4_avx512f(auVar36,1);
    auVar35 = vpmaxuq_avx512f(auVar36,ZEXT3264(auVar32));
    auVar29 = vpmaxuq_avx512vl(auVar35._0_16_,auVar35._16_16_);
    auVar30 = vpshufd_avx(auVar29,0xee);
    auVar30 = vpmaxuq_avx512vl(auVar29,auVar30);
    uVar19 = auVar30._0_8_;
  }
  uVar26 = (int)uVar15 * 100;
  uVar13 = (((uint)((ulong)uVar26 * 0xb21642c9 >> 0x20) & 0xfffffff0) + 0x30) / 0x25;
  uVar25 = uVar13 - (int)(uVar15 / 0x17);
  if (uVar25 != 0) {
    lVar11 = -(ulong)uVar25;
    auVar32 = vpmovsxbd_avx2(ZEXT816(0xe070c050a030801));
    auVar31._8_4_ = 8;
    auVar31._0_8_ = 0x800000008;
    auVar31._12_4_ = 8;
    auVar31._16_4_ = 8;
    auVar31._20_4_ = 8;
    auVar31._24_4_ = 8;
    auVar31._28_4_ = 8;
    auVar3 = vpmovsxbd_avx2(ZEXT816(0x80d080c100e1008));
    auVar4 = vpmovsxbd_avx2(ZEXT816(0x607040205010300));
    auVar5 = vpmovsxbd_avx2(ZEXT816(0x60e07050b0a0301));
    auVar6 = vpmovsxbd_avx2(ZEXT816(0x4000000));
    auVar44._8_4_ = 0x17;
    auVar44._0_8_ = 0x1700000017;
    auVar44._12_4_ = 0x17;
    auVar44._16_4_ = 0x17;
    auVar44._20_4_ = 0x17;
    auVar44._24_4_ = 0x17;
    auVar44._28_4_ = 0x17;
    do {
      auVar39 = auVar40._0_32_;
      auVar33 = vpblendd_avx2(auVar41._0_32_,auVar39,0xaa);
      *pauVar21 = auVar33;
      auVar33 = vpermt2d_avx512vl(auVar41._0_32_,auVar32,auVar39);
      pauVar21[1] = auVar33;
      auVar33 = vpaddd_avx2(auVar39,auVar31);
      auVar7 = vpermd_avx2(auVar34,*pauVar23);
      auVar43 = vpblendd_avx2(auVar7,auVar33,0xaa);
      pauVar21[2] = auVar43;
      auVar33 = vpermt2d_avx512vl(auVar7,auVar32,auVar33);
      pauVar21[3] = auVar33;
      auVar33 = vpaddd_avx2(auVar39,auVar3);
      auVar7 = vpermd_avx2(auVar4,pauVar23[1]);
      iVar27 = *(int *)(pauVar23[1] + 8);
      pauVar23 = pauVar23 + 2;
      auVar43 = vpblendd_avx2(auVar33,auVar7,5);
      pauVar21[4] = auVar43;
      uVar16 = uVar16 + 1;
      if (uVar18 <= uVar16) {
        uVar16 = 0;
      }
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16] =
           local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar16] + (ulong)(uint)(iVar27 + iVar14);
      auVar33 = vpermt2d_avx512vl(auVar7,auVar5,auVar33);
      auVar33 = vpaddd_avx2(auVar33,auVar6);
      auVar41 = ZEXT3264(auVar33);
      auVar33 = vpaddd_avx2(auVar44,auVar39);
      auVar40 = ZEXT3264(auVar33);
      iVar14 = iVar14 + 0x17;
      pauVar21 = (undefined1 (*) [32])(pauVar21[4] + 0x14);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0);
  }
  iVar27 = uVar26 / 0x17 - uVar13;
  if (iVar27 != 0) {
    piVar24 = (int *)(pauVar23[1] + 8);
    do {
      uVar16 = uVar16 + 1;
      if (uVar18 <= uVar16) {
        uVar16 = 0;
      }
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16] =
           local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar16] + (ulong)(uint)(*piVar24 + iVar14);
      piVar24 = piVar24 + 0x10;
      iVar14 = iVar14 + 0x17;
      iVar27 = iVar27 + -1;
    } while (iVar27 != 0);
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar17 = 0;
  }
  else {
    auVar41 = vpbroadcastq_avx512f();
    auVar41 = vpsrlq_avx512f(auVar41,3);
    auVar35 = ZEXT1664((undefined1  [16])0x0);
    uVar15 = 0;
    auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar36 = vmovdqa64_avx512f(auVar35);
      auVar35 = vpbroadcastq_avx512f();
      auVar35 = vporq_avx512f(auVar35,auVar40);
      uVar18 = vpcmpuq_avx512f(auVar35,auVar41,2);
      auVar35 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (local_48.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar15));
      auVar37._8_8_ = (ulong)((byte)(uVar18 >> 1) & 1) * auVar35._8_8_;
      auVar37._0_8_ = (ulong)((byte)uVar18 & 1) * auVar35._0_8_;
      auVar37._16_8_ = (ulong)((byte)(uVar18 >> 2) & 1) * auVar35._16_8_;
      auVar37._24_8_ = (ulong)((byte)(uVar18 >> 3) & 1) * auVar35._24_8_;
      auVar37._32_8_ = (ulong)((byte)(uVar18 >> 4) & 1) * auVar35._32_8_;
      auVar37._40_8_ = (ulong)((byte)(uVar18 >> 5) & 1) * auVar35._40_8_;
      auVar37._48_8_ = (ulong)((byte)(uVar18 >> 6) & 1) * auVar35._48_8_;
      auVar37._56_8_ = (uVar18 >> 7) * auVar35._56_8_;
      auVar35 = vpmaxuq_avx512f(auVar36,auVar37);
      uVar15 = uVar15 + 8;
    } while ((((ulong)((long)local_48.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish +
                      (-8 - (long)local_48.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) >> 3) + 8 &
             0x3ffffffffffffff8) != uVar15);
    auVar41 = vmovdqa64_avx512f(auVar35);
    bVar2 = (bool)((byte)uVar18 & 1);
    auVar40._0_8_ = (ulong)bVar2 * auVar41._0_8_ | (ulong)!bVar2 * auVar36._0_8_;
    bVar2 = (bool)((byte)(uVar18 >> 1) & 1);
    auVar40._8_8_ = (ulong)bVar2 * auVar41._8_8_ | (ulong)!bVar2 * auVar36._8_8_;
    bVar2 = (bool)((byte)(uVar18 >> 2) & 1);
    auVar40._16_8_ = (ulong)bVar2 * auVar41._16_8_ | (ulong)!bVar2 * auVar36._16_8_;
    bVar2 = (bool)((byte)(uVar18 >> 3) & 1);
    auVar40._24_8_ = (ulong)bVar2 * auVar41._24_8_ | (ulong)!bVar2 * auVar36._24_8_;
    bVar2 = (bool)((byte)(uVar18 >> 4) & 1);
    auVar40._32_8_ = (ulong)bVar2 * auVar41._32_8_ | (ulong)!bVar2 * auVar36._32_8_;
    bVar2 = (bool)((byte)(uVar18 >> 5) & 1);
    auVar40._40_8_ = (ulong)bVar2 * auVar41._40_8_ | (ulong)!bVar2 * auVar36._40_8_;
    bVar2 = (bool)((byte)(uVar18 >> 6) & 1);
    auVar40._48_8_ = (ulong)bVar2 * auVar41._48_8_ | (ulong)!bVar2 * auVar36._48_8_;
    auVar40._56_8_ = (uVar18 >> 7) * auVar41._56_8_ | (ulong)!SUB81(uVar18 >> 7,0) * auVar36._56_8_;
    auVar34 = vextracti64x4_avx512f(auVar40,1);
    auVar41 = vpmaxuq_avx512f(auVar40,ZEXT3264(auVar34));
    auVar29 = vpmaxuq_avx512vl(auVar41._0_16_,auVar41._16_16_);
    auVar30 = vpshufd_avx(auVar29,0xee);
    auVar30 = vpmaxuq_avx512vl(auVar29,auVar30);
    uVar17 = auVar30._0_8_;
  }
  printf("Day 09 Part 1: %lu\nDay 09 Part 2: %lu\n",uVar19,uVar17);
  free(__ptr);
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void day09(input_t input) {
	uint32_t n_players = 0, n_points = 0;
	for (uint32_t n = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 10) {
			n = 10 * n + c;
		} else if (n && *input.s == ' ') {
			(n_players ? n_points : n_players) = n;
			n = 0;
		}
	}

	// State after first round, from puzzle description
	constexpr std::array<int32_t, 22> initial = {
		 2, 20, 10, 21,  5, 22, 11,  1, 12,  6, 13,
		 3, 14,  7, 15,  0, 16,  8, 17,  4, 18, 19,
	};

	// Next marbles up for play, interleaved
	auto new_marbles = _mm256_setr_epi32(28, 24, 29, 25, 30, 26, 31, 27);

	// Initialize the playing field
	auto marbles = (int32_t *) aligned_alloc(32, n_points * 384);
	std::copy(initial.begin(), initial.end(), marbles);
	auto Mnext = marbles, Mend = marbles + 22;

	// Initialize score sheet
	if (n_players % 23 == 0) {
		n_players /= 23;
	}
	size_t cur_player = 0;
	std::vector<uint64_t> score(n_players);
	score[cur_player] = 32;

	const auto append = [&](size_t step, const __m256i& v) {
		_mm256_storeu_si256((__m256i *) Mend, v);
		Mend += step;
	};

	const auto load_next = [&]() {
		auto m = _mm256_load_si256((__m256i *) Mnext);
		Mnext += 8;
		return m;
	};

	// Prime the AVX2 register with the first group of 8 marbles
	auto M = _mm256_permutevar8x32_epi32(load_next(), _mm256_setr_epi32(0, 4, 1, 5, 2, 6, 3, 7));

	uint32_t turn = 46;

	auto simulate = [&](size_t count) {
		for (; count--; turn += 23) {
			// First 8 turns
			append(8, _mm256_blend_epi32(M, new_marbles, 0xaa));
			append(8, _mm256_shuffle_epi32(_mm256_blend_epi32(M, new_marbles, 0x55), 0xb1));

			new_marbles = _mm256_add_epi32(new_marbles, _mm256_set1_epi32(8));

			// Next 8 turns
			M = _mm256_permutevar8x32_epi32(load_next(), _mm256_setr_epi32(0, 4, 1, 5, 2, 6, 3, 7));
			append(8, _mm256_blend_epi32(M, new_marbles, 0xaa));
			append(8, _mm256_shuffle_epi32(_mm256_blend_epi32(M, new_marbles, 0x55), 0xb1));

			new_marbles = _mm256_add_epi32(new_marbles, _mm256_setr_epi32(0, 8, 6, 8, 4, 0, 5, 0));

			// Final 7 turns
			M = _mm256_permutevar8x32_epi32(load_next(), _mm256_setr_epi32(0, 3, 1, 5, 2, 4, 7, 6));
			append(5, _mm256_blend_epi32(M, new_marbles, 0xfa));

			cur_player++;
			cur_player &= -(cur_player < n_players);
			score[cur_player] += turn + _mm256_extract_epi32(M, 4);

			// Prepare the first 8 marbles of the next round
			M = _mm256_blend_epi32(_mm256_shuffle_epi32(M, 0x8d), new_marbles, 0x4c);
			M = _mm256_add_epi32(M, _mm256_setr_epi32(0, 0, 0, 4, 0, 0, 0, 0));

			new_marbles = _mm256_add_epi32(new_marbles, _mm256_setr_epi32(15, 7, 9, 7, 11, 15, 10, 15));
		}
	};

	// Part 1
	auto n_rounds1 = n_points / 23;
	simulate(n_rounds1 - 1);
	uint64_t part1 = 0;

	for (auto&& s : score) {
		part1 = std::max(part1, s);
	}

	// Part 2: 100x the number of points
	auto n_rounds2 = 100 * n_points / 23;

	// Simulate only enough to generate the scoreballs
	auto n_simulate2 = (n_rounds2 + 3) * 16 / 37;
	simulate(n_simulate2 - n_rounds1);
	n_rounds2 -= n_simulate2;

	// Tally up the remaining scoreballs
	for (Mnext += 10; n_rounds2--; Mnext += 16, turn += 23) {
		cur_player++;
		cur_player &= -(cur_player < n_players);
		score[cur_player] += turn + *Mnext;
	}

	uint64_t part2 = 0;
	for (auto&& s : score) {
		part2 = std::max(part2, s);
	}

	printf("Day 09 Part 1: %lu\nDay 09 Part 2: %lu\n", part1, part2);

	free(marbles);
}